

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::GetPanId
          (Error *__return_storage_ptr__,CommissionerApp *this,uint16_t *aPanId)

{
  ErrorCode EVar1;
  element_type *peVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar7;
  format_args args;
  format_args args_00;
  writer write;
  string local_b8;
  undefined1 local_98 [8];
  char *local_90;
  size_t local_88;
  char local_80 [8];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  parse_func local_70 [1];
  ErrorCode local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  writer local_38;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar4 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar4 == '\0') {
    local_98._0_4_ = none_type;
    local_90 = "the commissioner is not active";
    local_88 = 0x1e;
    local_80 = (char  [8])0x0;
    local_70[0] = (parse_func)0x0;
    pcVar6 = "the commissioner is not active";
    local_78 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98;
    do {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_98);
      }
      pcVar6 = pcVar5;
    } while (pcVar5 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_98;
    ::fmt::v10::vformat_abi_cxx11_(&local_b8,(v10 *)0x24ee20,(string_view)ZEXT816(0x1e),args_00);
    local_60 = kInvalidState;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
  }
  else {
    peVar2 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Commissioner[0x1a])
              ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98,peVar2,&this->mActiveDataset);
    __return_storage_ptr__->mCode = local_98._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_90)
    ;
    EVar1 = __return_storage_ptr__->mCode;
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (EVar1 != kNone) {
      return __return_storage_ptr__;
    }
    if (((this->mActiveDataset).mPresentFlags & 0x100) != 0) {
      *aPanId = (this->mActiveDataset).mPanId;
      return __return_storage_ptr__;
    }
    local_98._0_4_ = none_type;
    pcVar6 = "cannot find valid PAN ID in Active Operational Dataset";
    local_90 = "cannot find valid PAN ID in Active Operational Dataset";
    local_88 = 0x36;
    local_80 = (char  [8])0x0;
    local_70[0] = (parse_func)0x0;
    local_78 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98;
    local_38.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_98;
    do {
      if (pcVar6 == "") break;
      pcVar5 = pcVar6;
      if (*pcVar6 == '{') {
LAB_001b0553:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_38,pcVar6,pcVar5);
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_98);
        bVar7 = true;
      }
      else {
        pcVar5 = pcVar6 + 1;
        bVar7 = pcVar5 != "";
        if (bVar7) {
          if (*pcVar5 != '{') {
            pcVar3 = pcVar6 + 2;
            do {
              pcVar5 = pcVar3;
              bVar7 = pcVar5 != "";
              if (pcVar5 == "") goto LAB_001b054f;
              pcVar3 = pcVar5 + 1;
            } while (*pcVar5 != '{');
          }
          bVar7 = true;
        }
LAB_001b054f:
        if (bVar7) goto LAB_001b0553;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_38,pcVar6,"");
        bVar7 = false;
      }
    } while (bVar7);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_98;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"cannot find valid PAN ID in Active Operational Dataset",
               (string_view)ZEXT816(0x36),args);
    local_60 = kNotFound;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
  }
  __return_storage_ptr__->mCode = local_60;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetPanId(uint16_t &aPanId)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    SuccessOrExit(error = mCommissioner->GetActiveDataset(mActiveDataset, 0xFFFF));

    VerifyOrExit(mActiveDataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit,
                 error = ERROR_NOT_FOUND("cannot find valid PAN ID in Active Operational Dataset"));
    aPanId = mActiveDataset.mPanId;

exit:
    return error;
}